

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_4_4_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  float *data;
  int c1_4;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  int c2;
  int iVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  float *pfVar48;
  float *pfVar49;
  long lVar50;
  long lVar51;
  int c2_2;
  float *pfVar52;
  int c1;
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  float fVar97;
  undefined1 auVar99 [12];
  undefined1 auVar98 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  int data_width;
  
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar96 = ZEXT1664(auVar67);
  auVar68._8_4_ = 0x3effffff;
  auVar68._0_8_ = 0x3effffff3effffff;
  auVar68._12_4_ = 0x3effffff;
  auVar98 = ZEXT1664(auVar68);
  fVar75 = ipoint->scale;
  auVar102 = ZEXT464((uint)fVar75);
  auVar60 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)fVar75),auVar67,0xf8);
  auVar60 = ZEXT416((uint)(fVar75 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  iVar58 = (int)auVar60._0_4_;
  fVar73 = -0.08 / (fVar75 * fVar75);
  auVar61 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)ipoint->x),auVar67,0xf8);
  auVar61 = ZEXT416((uint)(ipoint->x + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62._0_8_ = (double)auVar61._0_4_;
  auVar62._8_8_ = auVar61._8_8_;
  auVar66._0_8_ = (double)fVar75;
  auVar66._8_8_ = 0;
  auVar61 = vfmadd231sd_fma(auVar62,auVar66,ZEXT816(0x3fe0000000000000));
  auVar65._0_4_ = (float)auVar61._0_8_;
  auVar65._4_12_ = auVar61._4_12_;
  auVar61 = vpternlogd_avx512vl(auVar68,ZEXT416((uint)ipoint->y),auVar67,0xf8);
  auVar61 = ZEXT416((uint)(ipoint->y + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar63._0_8_ = (double)auVar61._0_4_;
  auVar63._8_8_ = auVar61._8_8_;
  auVar61 = vfmadd231sd_fma(auVar63,auVar66,ZEXT816(0x3fe0000000000000));
  auVar64._0_4_ = (float)auVar61._0_8_;
  auVar64._4_12_ = auVar61._4_12_;
  auVar61._0_4_ = (int)auVar60._0_4_;
  auVar61._4_4_ = (int)auVar60._4_4_;
  auVar61._8_4_ = (int)auVar60._8_4_;
  auVar61._12_4_ = (int)auVar60._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar61);
  fVar7 = auVar65._0_4_ - auVar60._0_4_;
  fVar8 = auVar64._0_4_ - auVar60._0_4_;
  auVar60 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar75),auVar65);
  auVar61 = vpternlogd_avx512vl(auVar68,auVar60,auVar67,0xf8);
  auVar60 = ZEXT416((uint)(auVar60._0_4_ + auVar61._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = ZEXT416((uint)fVar75);
  if (iVar58 < (int)auVar60._0_4_) {
    auVar60 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar61,auVar64);
    auVar69._8_4_ = 0x3effffff;
    auVar69._0_8_ = 0x3effffff3effffff;
    auVar69._12_4_ = 0x3effffff;
    auVar70._8_4_ = 0x80000000;
    auVar70._0_8_ = 0x8000000080000000;
    auVar70._12_4_ = 0x80000000;
    auVar62 = vpternlogd_avx512vl(auVar70,auVar60,auVar69,0xea);
    auVar60 = ZEXT416((uint)(auVar60._0_4_ + auVar62._0_4_));
    auVar60 = vroundss_avx(auVar60,auVar60,0xb);
    if (iVar58 < (int)auVar60._0_4_) {
      auVar60 = vfmadd231ss_fma(auVar65,auVar61,ZEXT416(0x41300000));
      auVar71._8_4_ = 0x80000000;
      auVar71._0_8_ = 0x8000000080000000;
      auVar71._12_4_ = 0x80000000;
      auVar62 = vpternlogd_avx512vl(auVar71,auVar60,auVar69,0xea);
      auVar60 = ZEXT416((uint)(auVar60._0_4_ + auVar62._0_4_));
      auVar60 = vroundss_avx(auVar60,auVar60,0xb);
      if ((int)auVar60._0_4_ + iVar58 <= iimage->width) {
        auVar60 = vfmadd231ss_fma(auVar64,auVar61,ZEXT416(0x41300000));
        auVar17._8_4_ = 0x80000000;
        auVar17._0_8_ = 0x8000000080000000;
        auVar17._12_4_ = 0x80000000;
        auVar62 = vpternlogd_avx512vl(auVar69,auVar60,auVar17,0xf8);
        auVar60 = ZEXT416((uint)(auVar60._0_4_ + auVar62._0_4_));
        auVar60 = vroundss_avx(auVar60,auVar60,0xb);
        if ((int)auVar60._0_4_ + iVar58 <= iimage->height) {
          fVar7 = fVar7 + 0.5;
          fVar8 = fVar8 + 0.5;
          pfVar48 = iimage->data;
          iVar1 = iimage->data_width;
          iVar35 = iVar58 * 2;
          pfVar52 = haarResponseY + 0x4b;
          pfVar49 = haarResponseX + 0x4b;
          uVar28 = 0xfffffff4;
          do {
            auVar60._0_4_ = (float)(int)uVar28;
            auVar99 = in_ZMM8._4_12_;
            auVar60._4_12_ = auVar99;
            auVar60 = vfmadd213ss_fma(auVar60,auVar61,ZEXT416((uint)fVar8));
            iVar24 = (int)auVar60._0_4_;
            auVar83._0_4_ = (float)(int)(uVar28 | 1);
            auVar83._4_12_ = auVar99;
            auVar60 = vfmadd213ss_fma(auVar83,auVar61,ZEXT416((uint)fVar8));
            iVar25 = (int)auVar60._0_4_;
            auVar84._0_4_ = (float)(int)(uVar28 | 2);
            auVar84._4_12_ = auVar99;
            auVar60 = vfmadd213ss_fma(auVar84,auVar61,ZEXT416((uint)fVar8));
            iVar26 = (int)auVar60._0_4_;
            auVar85._0_4_ = (float)(int)(uVar28 | 3);
            auVar85._4_12_ = auVar99;
            auVar60 = vfmadd213ss_fma(auVar85,auVar61,ZEXT416((uint)fVar8));
            iVar31 = (int)auVar60._0_4_;
            iVar39 = (iVar24 + -1) * iVar1;
            iVar23 = (iVar24 + -1 + iVar58) * iVar1;
            iVar43 = (iVar24 + -1 + iVar35) * iVar1;
            iVar44 = (iVar25 + -1) * iVar1;
            iVar24 = (iVar25 + -1 + iVar58) * iVar1;
            iVar40 = (iVar25 + -1 + iVar35) * iVar1;
            iVar30 = (iVar26 + -1) * iVar1;
            iVar25 = (iVar26 + -1 + iVar58) * iVar1;
            iVar41 = (iVar26 + -1 + iVar35) * iVar1;
            iVar38 = (iVar31 + -1) * iVar1;
            iVar26 = (iVar31 + -1 + iVar58) * iVar1;
            iVar31 = (iVar31 + -1 + iVar35) * iVar1;
            lVar56 = 0;
            do {
              iVar53 = (int)lVar56;
              auVar86._0_4_ = (float)(iVar53 + -0xc);
              auVar99 = auVar98._4_12_;
              auVar86._4_12_ = auVar99;
              auVar60 = vfmadd213ss_fma(auVar86,auVar61,ZEXT416((uint)fVar7));
              iVar42 = (int)auVar60._0_4_;
              auVar87._0_4_ = (float)(iVar53 + -0xb);
              auVar87._4_12_ = auVar99;
              auVar60 = vfmadd213ss_fma(auVar87,auVar61,ZEXT416((uint)fVar7));
              iVar32 = (int)auVar60._0_4_;
              auVar91._0_4_ = (float)(iVar53 + -10);
              auVar91._4_12_ = auVar99;
              auVar88._0_4_ = (float)(iVar53 + -9);
              auVar88._4_12_ = auVar99;
              iVar45 = iVar42 + -1 + iVar58;
              iVar27 = iVar42 + -1 + iVar35;
              auVar60 = vfmadd213ss_fma(auVar91,auVar61,ZEXT416((uint)fVar7));
              fVar75 = pfVar48[iVar23 + -1 + iVar42];
              fVar74 = pfVar48[iVar43 + -1 + iVar42];
              fVar92 = pfVar48[iVar43 + iVar27];
              fVar94 = pfVar48[iVar39 + -1 + iVar42];
              fVar9 = pfVar48[iVar39 + iVar27];
              auVar63 = SUB6416(ZEXT464(0x40000000),0);
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar39 + iVar45] -
                                                      pfVar48[iVar43 + iVar45])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar23 + iVar27];
              pfVar49[lVar56 + -0x4b] = (fVar74 - fVar9) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x4b] = auVar62._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar24 + -1 + iVar42];
              fVar74 = pfVar48[iVar40 + -1 + iVar42];
              fVar92 = pfVar48[iVar40 + iVar27];
              fVar94 = pfVar48[iVar44 + -1 + iVar42];
              fVar9 = pfVar48[iVar44 + iVar27];
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar44 + iVar45] -
                                                      pfVar48[iVar40 + iVar45])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar24 + iVar27];
              pfVar49[lVar56 + -0x33] = (fVar74 - fVar9) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x33] = auVar62._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar25 + -1 + iVar42];
              fVar74 = pfVar48[iVar41 + -1 + iVar42];
              fVar92 = pfVar48[iVar41 + iVar27];
              fVar94 = pfVar48[iVar30 + -1 + iVar42];
              fVar9 = pfVar48[iVar30 + iVar27];
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar45] -
                                                      pfVar48[iVar41 + iVar45])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar25 + iVar27];
              pfVar49[lVar56 + -0x1b] = (fVar74 - fVar9) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x1b] = auVar62._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar26 + -1 + iVar42];
              fVar74 = pfVar48[iVar31 + -1 + iVar42];
              in_ZMM8 = ZEXT464((uint)pfVar48[iVar27 + iVar31]);
              iVar36 = (int)auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(auVar88,auVar61,ZEXT416((uint)fVar7));
              fVar92 = pfVar48[iVar38 + iVar27];
              auVar64 = ZEXT416((uint)(pfVar48[iVar27 + iVar31] - pfVar48[iVar38 + -1 + iVar42]));
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar38 + iVar45] -
                                                      pfVar48[iVar45 + iVar31])),auVar63,auVar64);
              fVar94 = pfVar48[iVar26 + iVar27];
              pfVar49[lVar56 + -3] = (fVar74 - fVar92) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar94)),auVar63,auVar64);
              pfVar52[lVar56 + -3] = auVar62._0_4_ - (fVar74 - fVar92);
              iVar45 = iVar32 + -1 + iVar58;
              iVar27 = iVar32 + -1 + iVar35;
              fVar75 = pfVar48[iVar23 + -1 + iVar32];
              fVar74 = pfVar48[iVar43 + -1 + iVar32];
              fVar92 = pfVar48[iVar43 + iVar27];
              fVar94 = pfVar48[iVar39 + -1 + iVar32];
              fVar9 = pfVar48[iVar39 + iVar27];
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar39 + iVar45] -
                                                      pfVar48[iVar43 + iVar45])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar23 + iVar27];
              pfVar49[lVar56 + -0x4a] = (fVar74 - fVar9) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x4a] = auVar62._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar24 + -1 + iVar32];
              fVar74 = pfVar48[iVar40 + -1 + iVar32];
              fVar92 = pfVar48[iVar40 + iVar27];
              fVar94 = pfVar48[iVar44 + -1 + iVar32];
              fVar9 = pfVar48[iVar44 + iVar27];
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar44 + iVar45] -
                                                      pfVar48[iVar40 + iVar45])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar24 + iVar27];
              pfVar49[lVar56 + -0x32] = (fVar74 - fVar9) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x32] = auVar62._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar25 + -1 + iVar32];
              fVar74 = pfVar48[iVar41 + -1 + iVar32];
              fVar92 = pfVar48[iVar41 + iVar27];
              fVar94 = pfVar48[iVar30 + -1 + iVar32];
              fVar9 = pfVar48[iVar30 + iVar27];
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar45] -
                                                      pfVar48[iVar41 + iVar45])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar25 + iVar27];
              pfVar49[lVar56 + -0x1a] = (fVar74 - fVar9) + auVar62._0_4_;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x1a] = auVar62._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar26 + -1 + iVar32];
              fVar74 = pfVar48[iVar31 + -1 + iVar32];
              auVar98 = ZEXT464((uint)pfVar48[iVar27 + iVar31]);
              iVar42 = (int)auVar60._0_4_;
              fVar92 = pfVar48[iVar38 + iVar27];
              auVar62 = ZEXT416((uint)(pfVar48[iVar27 + iVar31] - pfVar48[iVar38 + -1 + iVar32]));
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar38 + iVar45] -
                                                      pfVar48[iVar45 + iVar31])),auVar63,auVar62);
              fVar94 = pfVar48[iVar26 + iVar27];
              pfVar49[lVar56 + -2] = (fVar74 - fVar92) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar94)),auVar63,auVar62);
              pfVar52[lVar56 + -2] = auVar60._0_4_ - (fVar74 - fVar92);
              iVar27 = iVar36 + -1 + iVar58;
              iVar32 = iVar36 + -1 + iVar35;
              fVar75 = pfVar48[iVar23 + -1 + iVar36];
              fVar74 = pfVar48[iVar43 + -1 + iVar36];
              fVar92 = pfVar48[iVar43 + iVar32];
              fVar94 = pfVar48[iVar39 + -1 + iVar36];
              fVar9 = pfVar48[iVar39 + iVar32];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar39 + iVar27] -
                                                      pfVar48[iVar43 + iVar27])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar23 + iVar32];
              pfVar49[lVar56 + -0x49] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x49] = auVar60._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar24 + -1 + iVar36];
              fVar74 = pfVar48[iVar40 + -1 + iVar36];
              fVar92 = pfVar48[iVar40 + iVar32];
              fVar94 = pfVar48[iVar44 + -1 + iVar36];
              fVar9 = pfVar48[iVar44 + iVar32];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar44 + iVar27] -
                                                      pfVar48[iVar40 + iVar27])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar24 + iVar32];
              pfVar49[lVar56 + -0x31] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x31] = auVar60._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar25 + -1 + iVar36];
              fVar74 = pfVar48[iVar41 + -1 + iVar36];
              fVar92 = pfVar48[iVar41 + iVar32];
              fVar94 = pfVar48[iVar30 + -1 + iVar36];
              fVar9 = pfVar48[iVar30 + iVar32];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar27] -
                                                      pfVar48[iVar41 + iVar27])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar25 + iVar32];
              pfVar49[lVar56 + -0x19] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x19] = auVar60._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar26 + -1 + iVar36];
              fVar74 = pfVar48[iVar31 + -1 + iVar36];
              fVar92 = pfVar48[iVar32 + iVar31];
              fVar94 = pfVar48[iVar38 + -1 + iVar36];
              fVar9 = pfVar48[iVar38 + iVar32];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar38 + iVar27] -
                                                      pfVar48[iVar27 + iVar31])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar26 + iVar32];
              pfVar49[lVar56 + -1] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -1] = auVar60._0_4_ - (fVar74 - fVar9);
              iVar27 = iVar42 + -1 + iVar58;
              iVar36 = iVar42 + -1 + iVar35;
              fVar75 = pfVar48[iVar23 + -1 + iVar42];
              fVar74 = pfVar48[iVar43 + -1 + iVar42];
              fVar92 = pfVar48[iVar43 + iVar36];
              fVar94 = pfVar48[iVar39 + -1 + iVar42];
              fVar9 = pfVar48[iVar39 + iVar36];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar39 + iVar27] -
                                                      pfVar48[iVar43 + iVar27])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar23 + iVar36];
              pfVar49[lVar56 + -0x48] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x48] = auVar60._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar24 + -1 + iVar42];
              fVar74 = pfVar48[iVar40 + -1 + iVar42];
              fVar92 = pfVar48[iVar40 + iVar36];
              fVar94 = pfVar48[iVar44 + -1 + iVar42];
              fVar9 = pfVar48[iVar44 + iVar36];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar44 + iVar27] -
                                                      pfVar48[iVar40 + iVar27])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar24 + iVar36];
              pfVar49[lVar56 + -0x30] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x30] = auVar60._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar25 + -1 + iVar42];
              fVar74 = pfVar48[iVar41 + -1 + iVar42];
              fVar92 = pfVar48[iVar41 + iVar36];
              fVar94 = pfVar48[iVar30 + -1 + iVar42];
              fVar9 = pfVar48[iVar30 + iVar36];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar27] -
                                                      pfVar48[iVar41 + iVar27])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              fVar80 = pfVar48[iVar25 + iVar36];
              pfVar49[lVar56 + -0x18] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56 + -0x18] = auVar60._0_4_ - (fVar74 - fVar9);
              fVar75 = pfVar48[iVar26 + -1 + iVar42];
              fVar74 = pfVar48[iVar31 + -1 + iVar42];
              fVar92 = pfVar48[iVar36 + iVar31];
              fVar94 = pfVar48[iVar38 + -1 + iVar42];
              fVar9 = pfVar48[iVar38 + iVar36];
              fVar80 = pfVar48[iVar26 + iVar36];
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar38 + iVar27] -
                                                      pfVar48[iVar27 + iVar31])),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar49[lVar56] = (fVar74 - fVar9) + auVar60._0_4_;
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar80)),auVar63,
                                        ZEXT416((uint)(fVar92 - fVar94)));
              pfVar52[lVar56] = auVar60._0_4_ - (fVar74 - fVar9);
              lVar56 = lVar56 + 4;
            } while (iVar53 + -0xc < 8);
            pfVar52 = pfVar52 + 0x60;
            pfVar49 = pfVar49 + 0x60;
            bVar2 = (int)uVar28 < 8;
            uVar28 = uVar28 + 4;
          } while (bVar2);
          goto LAB_00220259;
        }
      }
    }
  }
  iVar1 = iVar58 * 2;
  lVar56 = 0;
  uVar28 = 0xfffffff4;
  do {
    auVar60 = vpbroadcastd_avx512vl();
    auVar18._8_4_ = 3;
    auVar18._0_8_ = 0x200000003;
    auVar18._12_4_ = 2;
    auVar60 = vporq_avx512vl(auVar60,auVar18);
    auVar60 = vpinsrd_avx(auVar60,uVar28 | 1,2);
    auVar60 = vpinsrd_avx(auVar60,uVar28,3);
    auVar60 = vcvtdq2ps_avx(auVar60);
    auVar21._4_4_ = fVar8;
    auVar21._0_4_ = fVar8;
    auVar21._8_4_ = fVar8;
    auVar21._12_4_ = fVar8;
    auVar22._4_4_ = fVar75;
    auVar22._0_4_ = fVar75;
    auVar22._8_4_ = fVar75;
    auVar22._12_4_ = fVar75;
    auVar60 = vfmadd132ps_fma(auVar60,auVar21,auVar22);
    auVar6 = vcvtps2pd_avx(auVar60);
    uVar29 = vcmpps_avx512vl(auVar60,_DAT_00576190,0xd);
    auVar78._8_8_ = 0xbfe0000000000000;
    auVar78._0_8_ = 0xbfe0000000000000;
    auVar78._16_8_ = 0xbfe0000000000000;
    auVar78._24_8_ = 0xbfe0000000000000;
    auVar72._12_4_ = 0x3fe00000;
    auVar72._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar72._16_8_ = 0x3fe0000000000000;
    auVar72._24_8_ = 0x3fe0000000000000;
    auVar72 = vblendmpd_avx512vl(auVar78,auVar72);
    bVar2 = (bool)((byte)uVar29 & 1);
    bVar3 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar29 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar76._0_4_ =
         (int)((double)((ulong)bVar2 * auVar72._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar76._4_4_ =
         (int)((double)((ulong)bVar3 * auVar72._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar76._8_4_ =
         (int)((double)((ulong)bVar4 * auVar72._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar76._12_4_ =
         (int)((double)((ulong)bVar5 * auVar72._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar24 = iVar1 + auVar76._12_4_;
    iVar25 = auVar76._12_4_ + -1 + iVar58;
    iVar26 = auVar76._12_4_ + -1;
    iVar30 = iVar1 + auVar76._8_4_;
    iVar31 = auVar76._8_4_ + -1 + iVar58;
    iVar38 = auVar76._8_4_ + -1;
    iVar39 = iVar1 + auVar76._4_4_;
    iVar40 = auVar76._4_4_ + -1 + iVar58;
    auVar19._8_4_ = 1;
    auVar19._0_8_ = 0x100000001;
    auVar19._12_4_ = 1;
    uVar29 = vpcmpd_avx512vl(auVar76,auVar19,1);
    uVar59 = uVar29 & 0xf;
    uVar37 = uVar59 >> 1;
    uVar33 = uVar59 >> 2;
    uVar59 = uVar59 >> 3;
    iVar41 = auVar76._4_4_ + -1;
    iVar43 = iVar1 + auVar76._0_4_;
    iVar44 = auVar76._0_4_ + -1 + iVar58;
    iVar23 = auVar76._0_4_ + -1;
    lVar55 = lVar56;
    iVar35 = -0xc;
    do {
      auVar77._0_4_ = (float)iVar35;
      auVar95._4_12_ = auVar96._4_12_;
      auVar77._4_12_ = auVar95._4_12_;
      auVar95._0_4_ = (float)(iVar35 + 1);
      auVar64 = auVar102._0_16_;
      auVar60 = vfmadd213ss_fma(auVar77,auVar64,ZEXT416((uint)fVar7));
      auVar62 = vfmadd213ss_fma(auVar95,auVar64,ZEXT416((uint)fVar7));
      auVar96 = ZEXT1664(auVar62);
      auVar93._0_4_ = (float)(iVar35 + 2);
      auVar93._4_12_ = auVar98._4_12_;
      auVar63 = vfmadd213ss_fma(auVar93,auVar64,ZEXT416((uint)fVar7));
      auVar89._0_4_ = (float)(iVar35 + 3);
      auVar89._4_12_ = auVar98._4_12_;
      auVar64 = vfmadd213ss_fma(auVar89,auVar64,ZEXT416((uint)fVar7));
      fVar74 = auVar60._0_4_;
      iVar53 = (int)((double)((ulong)(0.0 <= fVar74) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar74) * -0x4020000000000000) + (double)fVar74);
      fVar94 = auVar62._0_4_;
      fVar92 = auVar63._0_4_;
      fVar74 = auVar64._0_4_;
      pfVar48 = (float *)((long)haarResponseY + lVar55);
      if (((iVar53 < 1 || uVar59 != 0) || (iimage->height < iVar24)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar62);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._12_4_,iVar53,iVar58,(float *)((long)haarResponseX + lVar55),pfVar48);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar49 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar26;
        fVar9 = pfVar49[iVar36 * iVar25 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._12_4_);
        fVar80 = pfVar49[iVar45 + -1 + iVar53];
        fVar10 = pfVar49[iVar45 + -1 + iVar27];
        fVar11 = pfVar49[iVar32 + -1 + iVar53];
        fVar12 = pfVar49[iVar32 + -1 + iVar27];
        fVar13 = pfVar49[iVar36 * iVar25 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar32 + iVar42] - pfVar49[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *(float *)((long)haarResponseX + lVar55) = (fVar80 - fVar12) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar48 = auVar60._0_4_ - (fVar80 - fVar12);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0x60);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0x60);
      if (((iVar53 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._8_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar38;
        fVar9 = pfVar52[iVar36 * iVar31 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._8_4_);
        fVar80 = pfVar52[iVar45 + -1 + iVar53];
        fVar10 = pfVar52[iVar45 + -1 + iVar27];
        fVar11 = pfVar52[iVar32 + -1 + iVar53];
        fVar12 = pfVar52[iVar32 + -1 + iVar27];
        fVar13 = pfVar52[iVar36 * iVar31 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar48 = (fVar80 - fVar12) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar49 = auVar60._0_4_ - (fVar80 - fVar12);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0xc0);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0xc0);
      if (((iVar53 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar39)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._4_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar41;
        fVar9 = pfVar52[iVar36 * iVar40 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._4_4_);
        fVar80 = pfVar52[iVar45 + -1 + iVar53];
        fVar10 = pfVar52[iVar45 + -1 + iVar27];
        fVar11 = pfVar52[iVar32 + -1 + iVar53];
        fVar12 = pfVar52[iVar32 + -1 + iVar27];
        fVar13 = pfVar52[iVar36 * iVar40 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar48 = (fVar80 - fVar12) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar49 = auVar60._0_4_ - (fVar80 - fVar12);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0x120);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0x120);
      if (((iVar53 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar43)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._0_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar32 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar45 = iVar36 * iVar23;
        fVar9 = pfVar52[iVar36 * iVar44 + -1 + iVar53];
        iVar42 = iVar36 * (iVar1 + -1 + auVar76._0_4_);
        fVar80 = pfVar52[iVar42 + -1 + iVar53];
        fVar10 = pfVar52[iVar42 + -1 + iVar27];
        fVar11 = pfVar52[iVar45 + -1 + iVar53];
        fVar12 = pfVar52[iVar45 + -1 + iVar27];
        fVar13 = pfVar52[iVar36 * iVar44 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar45 + iVar32] - pfVar52[iVar42 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar48 = (fVar80 - fVar12) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar49 = auVar60._0_4_ - (fVar80 - fVar12);
      }
      iVar53 = (int)((double)((ulong)(0.0 <= fVar94) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar94) * -0x4020000000000000) + (double)fVar94);
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 4);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 4);
      if (((iVar53 < 1 || uVar59 != 0) || (iimage->height < iVar24)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._12_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar26;
        fVar94 = pfVar52[iVar36 * iVar25 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._12_4_);
        fVar9 = pfVar52[iVar45 + -1 + iVar53];
        fVar80 = pfVar52[iVar45 + -1 + iVar27];
        fVar10 = pfVar52[iVar32 + -1 + iVar53];
        fVar11 = pfVar52[iVar32 + -1 + iVar27];
        fVar12 = pfVar52[iVar36 * iVar25 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar48 = (fVar9 - fVar11) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar94 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar49 = auVar60._0_4_ - (fVar9 - fVar11);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 100);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 100);
      if (((iVar53 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._8_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar38;
        fVar94 = pfVar52[iVar36 * iVar31 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._8_4_);
        fVar9 = pfVar52[iVar45 + -1 + iVar53];
        fVar80 = pfVar52[iVar45 + -1 + iVar27];
        fVar10 = pfVar52[iVar32 + -1 + iVar53];
        fVar11 = pfVar52[iVar32 + -1 + iVar27];
        fVar12 = pfVar52[iVar36 * iVar31 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar48 = (fVar9 - fVar11) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar94 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar49 = auVar60._0_4_ - (fVar9 - fVar11);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0xc4);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0xc4);
      if (((iVar53 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar39)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._4_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar41;
        fVar94 = pfVar52[iVar36 * iVar40 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._4_4_);
        fVar9 = pfVar52[iVar45 + -1 + iVar53];
        fVar80 = pfVar52[iVar45 + -1 + iVar27];
        fVar10 = pfVar52[iVar32 + -1 + iVar53];
        fVar11 = pfVar52[iVar32 + -1 + iVar27];
        fVar12 = pfVar52[iVar36 * iVar40 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar48 = (fVar9 - fVar11) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar94 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar49 = auVar60._0_4_ - (fVar9 - fVar11);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0x124);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0x124);
      if (((iVar53 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar43)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._0_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar32 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar45 = iVar36 * iVar23;
        fVar94 = pfVar52[iVar36 * iVar44 + -1 + iVar53];
        iVar42 = iVar36 * (iVar1 + -1 + auVar76._0_4_);
        fVar9 = pfVar52[iVar42 + -1 + iVar53];
        fVar80 = pfVar52[iVar42 + -1 + iVar27];
        fVar10 = pfVar52[iVar45 + -1 + iVar53];
        fVar11 = pfVar52[iVar45 + -1 + iVar27];
        fVar12 = pfVar52[iVar36 * iVar44 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar45 + iVar32] - pfVar52[iVar42 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar48 = (fVar9 - fVar11) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar94 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar10)));
        *pfVar49 = auVar60._0_4_ - (fVar9 - fVar11);
      }
      iVar53 = (int)((double)((ulong)(0.0 <= fVar92) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar92) * -0x4020000000000000) + (double)fVar92);
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 8);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 8);
      if (((iVar53 < 1 || uVar59 != 0) || (iimage->height < iVar24)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._12_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar26;
        fVar92 = pfVar52[iVar36 * iVar25 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._12_4_);
        fVar94 = pfVar52[iVar45 + -1 + iVar53];
        fVar9 = pfVar52[iVar45 + -1 + iVar27];
        fVar80 = pfVar52[iVar32 + -1 + iVar53];
        fVar10 = pfVar52[iVar32 + -1 + iVar27];
        fVar11 = pfVar52[iVar36 * iVar25 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar48 = (fVar94 - fVar10) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar49 = auVar60._0_4_ - (fVar94 - fVar10);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0x68);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0x68);
      if (((iVar53 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._8_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar38;
        fVar92 = pfVar52[iVar36 * iVar31 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._8_4_);
        fVar94 = pfVar52[iVar45 + -1 + iVar53];
        fVar9 = pfVar52[iVar45 + -1 + iVar27];
        fVar80 = pfVar52[iVar32 + -1 + iVar53];
        fVar10 = pfVar52[iVar32 + -1 + iVar27];
        fVar11 = pfVar52[iVar36 * iVar31 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar48 = (fVar94 - fVar10) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar49 = auVar60._0_4_ - (fVar94 - fVar10);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 200);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 200);
      if (((iVar53 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar39)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._4_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar41;
        fVar92 = pfVar52[iVar36 * iVar40 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._4_4_);
        fVar94 = pfVar52[iVar45 + -1 + iVar53];
        fVar9 = pfVar52[iVar45 + -1 + iVar27];
        fVar80 = pfVar52[iVar32 + -1 + iVar53];
        fVar10 = pfVar52[iVar32 + -1 + iVar27];
        fVar11 = pfVar52[iVar36 * iVar40 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar48 = (fVar94 - fVar10) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar49 = auVar60._0_4_ - (fVar94 - fVar10);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0x128);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0x128);
      if (((iVar53 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar43)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._0_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar32 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar45 = iVar36 * iVar23;
        fVar92 = pfVar52[iVar36 * iVar44 + -1 + iVar53];
        iVar42 = iVar36 * (iVar1 + -1 + auVar76._0_4_);
        fVar94 = pfVar52[iVar42 + -1 + iVar53];
        fVar9 = pfVar52[iVar42 + -1 + iVar27];
        fVar80 = pfVar52[iVar45 + -1 + iVar53];
        fVar10 = pfVar52[iVar45 + -1 + iVar27];
        fVar11 = pfVar52[iVar36 * iVar44 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar45 + iVar32] - pfVar52[iVar42 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar48 = (fVar94 - fVar10) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar80)));
        *pfVar49 = auVar60._0_4_ - (fVar94 - fVar10);
      }
      iVar53 = (int)((double)((ulong)(0.0 <= fVar74) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar74) * -0x4020000000000000) + (double)fVar74);
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0xc);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0xc);
      if (((iVar53 < 1 || uVar59 != 0) || (iimage->height < iVar24)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._12_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar26;
        fVar74 = pfVar52[iVar36 * iVar25 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._12_4_);
        fVar92 = pfVar52[iVar45 + -1 + iVar53];
        fVar94 = pfVar52[iVar45 + -1 + iVar27];
        fVar9 = pfVar52[iVar32 + -1 + iVar53];
        fVar80 = pfVar52[iVar32 + -1 + iVar27];
        fVar10 = pfVar52[iVar36 * iVar25 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar48 = (fVar92 - fVar80) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar49 = auVar60._0_4_ - (fVar92 - fVar80);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0x6c);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0x6c);
      if (((iVar53 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._8_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar38;
        fVar74 = pfVar52[iVar36 * iVar31 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._8_4_);
        fVar92 = pfVar52[iVar45 + -1 + iVar53];
        fVar94 = pfVar52[iVar45 + -1 + iVar27];
        fVar9 = pfVar52[iVar32 + -1 + iVar53];
        fVar80 = pfVar52[iVar32 + -1 + iVar27];
        fVar10 = pfVar52[iVar36 * iVar31 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar48 = (fVar92 - fVar80) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar49 = auVar60._0_4_ - (fVar92 - fVar80);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 0xcc);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 0xcc);
      if (((iVar53 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar39)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._4_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar42 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar32 = iVar36 * iVar41;
        fVar74 = pfVar52[iVar36 * iVar40 + -1 + iVar53];
        iVar45 = iVar36 * (iVar1 + -1 + auVar76._4_4_);
        fVar92 = pfVar52[iVar45 + -1 + iVar53];
        fVar94 = pfVar52[iVar45 + -1 + iVar27];
        fVar9 = pfVar52[iVar32 + -1 + iVar53];
        fVar80 = pfVar52[iVar32 + -1 + iVar27];
        fVar10 = pfVar52[iVar36 * iVar40 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar32 + iVar42] - pfVar52[iVar45 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar48 = (fVar92 - fVar80) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar49 = auVar60._0_4_ - (fVar92 - fVar80);
      }
      pfVar48 = (float *)((long)haarResponseX + lVar55 + 300);
      pfVar49 = (float *)((long)haarResponseY + lVar55 + 300);
      if (((iVar53 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar43)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        auVar96 = ZEXT1664(auVar96._0_16_);
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar76._0_4_,iVar53,iVar58,pfVar48,pfVar49);
      }
      else {
        iVar32 = iVar53 + -1 + iVar58;
        pfVar52 = iimage->data;
        iVar36 = iimage->data_width;
        iVar45 = iVar36 * iVar23;
        fVar74 = pfVar52[iVar36 * iVar44 + -1 + iVar53];
        iVar42 = iVar36 * (iVar1 + -1 + auVar76._0_4_);
        fVar92 = pfVar52[iVar42 + -1 + iVar53];
        fVar94 = pfVar52[iVar42 + -1 + iVar27];
        fVar9 = pfVar52[iVar45 + -1 + iVar53];
        fVar80 = pfVar52[iVar45 + -1 + iVar27];
        fVar10 = pfVar52[iVar36 * iVar44 + -1 + iVar27];
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar45 + iVar32] - pfVar52[iVar42 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar48 = (fVar92 - fVar80) + auVar60._0_4_;
        auVar60 = vfmadd213ss_fma(ZEXT416((uint)(fVar74 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar94 - fVar9)));
        *pfVar49 = auVar60._0_4_ - (fVar92 - fVar80);
      }
      auVar102 = ZEXT1664(auVar61);
      lVar55 = lVar55 + 0x10;
      bVar2 = iVar35 < 8;
      iVar35 = iVar35 + 4;
    } while (bVar2);
    lVar56 = lVar56 + 0x180;
    bVar2 = (int)uVar28 < 8;
    uVar28 = uVar28 + 4;
  } while (bVar2);
LAB_00220259:
  fVar75 = auVar102._0_4_;
  auVar101._8_4_ = 0x3effffff;
  auVar101._0_8_ = 0x3effffff3effffff;
  auVar101._12_4_ = 0x3effffff;
  auVar100._8_4_ = 0x80000000;
  auVar100._0_8_ = 0x8000000080000000;
  auVar100._12_4_ = 0x80000000;
  auVar60 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 0.5)),auVar100,0xf8);
  auVar60 = ZEXT416((uint)(fVar75 * 0.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 1.5)),auVar100,0xf8);
  auVar61 = ZEXT416((uint)(fVar75 * 1.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 2.5)),auVar100,0xf8);
  auVar62 = ZEXT416((uint)(fVar75 * 2.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 3.5)),auVar100,0xf8);
  auVar63 = ZEXT416((uint)(fVar75 * 3.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 4.5)),auVar100,0xf8);
  auVar64 = ZEXT416((uint)(fVar75 * 4.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 5.5)),auVar100,0xf8);
  auVar65 = ZEXT416((uint)(fVar75 * 5.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 6.5)),auVar100,0xf8);
  auVar66 = ZEXT416((uint)(fVar75 * 6.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 7.5)),auVar100,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + fVar75 * 7.5));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 8.5)),auVar100,0xf8);
  auVar68 = ZEXT416((uint)(fVar75 * 8.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 9.5)),auVar100,0xf8);
  auVar69 = ZEXT416((uint)(fVar75 * 9.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 10.5)),auVar100,0xf8);
  auVar70 = ZEXT416((uint)(fVar75 * 10.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar75 * 11.5)),auVar100,0xf8);
  auVar71 = ZEXT416((uint)(fVar75 * 11.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  fVar80 = auVar62._0_4_;
  fVar75 = fVar80 + auVar61._0_4_;
  fVar7 = fVar80 + auVar60._0_4_;
  fVar8 = fVar80 - auVar60._0_4_;
  fVar74 = fVar80 - auVar61._0_4_;
  fVar92 = fVar80 - auVar63._0_4_;
  fVar94 = fVar80 - auVar64._0_4_;
  fVar9 = fVar80 - auVar65._0_4_;
  fVar80 = fVar80 - auVar66._0_4_;
  fVar97 = auVar67._0_4_;
  fVar10 = fVar97 - auVar63._0_4_;
  fVar11 = fVar97 - auVar64._0_4_;
  fVar12 = fVar97 - auVar65._0_4_;
  fVar13 = fVar97 - auVar66._0_4_;
  fVar14 = fVar97 - auVar68._0_4_;
  fVar15 = fVar97 - auVar69._0_4_;
  fVar16 = fVar97 - auVar70._0_4_;
  fVar97 = fVar97 - auVar71._0_4_;
  gauss_s1_c0[0] = expf(fVar75 * fVar75 * fVar73);
  gauss_s1_c0[1] = expf(fVar7 * fVar7 * fVar73);
  gauss_s1_c0[2] = expf(fVar8 * fVar8 * fVar73);
  gauss_s1_c0[3] = expf(fVar74 * fVar74 * fVar73);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar92 * fVar92 * fVar73);
  gauss_s1_c0[6] = expf(fVar94 * fVar94 * fVar73);
  gauss_s1_c0[7] = expf(fVar9 * fVar9 * fVar73);
  gauss_s1_c0[8] = expf(fVar80 * fVar80 * fVar73);
  gauss_s1_c1[0] = expf(fVar10 * fVar10 * fVar73);
  gauss_s1_c1[1] = expf(fVar11 * fVar11 * fVar73);
  gauss_s1_c1[2] = expf(fVar12 * fVar12 * fVar73);
  gauss_s1_c1[3] = expf(fVar13 * fVar13 * fVar73);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar14 * fVar14 * fVar73);
  gauss_s1_c1[6] = expf(fVar15 * fVar15 * fVar73);
  gauss_s1_c1[7] = expf(fVar16 * fVar16 * fVar73);
  gauss_s1_c1[8] = expf(fVar97 * fVar97 * fVar73);
  uVar29 = 0xfffffff8;
  lVar56 = 0;
  fVar75 = 0.0;
  auVar79._8_4_ = 0x7fffffff;
  auVar79._0_8_ = 0x7fffffff7fffffff;
  auVar79._12_4_ = 0x7fffffff;
  lVar55 = 0;
  lVar50 = 0;
  do {
    pfVar48 = gauss_s1_c1;
    uVar28 = (uint)uVar29;
    if (uVar28 != 7) {
      pfVar48 = gauss_s1_c0;
    }
    if (uVar28 == 0xfffffff8) {
      pfVar48 = gauss_s1_c1;
    }
    lVar55 = (long)(int)lVar55;
    iVar58 = (int)lVar50;
    lVar50 = (long)iVar58;
    lVar47 = (long)haarResponseX + lVar56;
    lVar34 = (long)haarResponseY + lVar56;
    uVar46 = 0xfffffff8;
    uVar37 = 0;
    do {
      pfVar49 = gauss_s1_c1;
      if (uVar46 != 7) {
        pfVar49 = gauss_s1_c0;
      }
      if (uVar46 == 0xfffffff8) {
        pfVar49 = gauss_s1_c1;
      }
      uVar59 = (ulong)(uVar46 >> 0x1c & 0xfffffff8);
      auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar33 = uVar37;
      lVar54 = lVar47;
      lVar57 = lVar34;
      do {
        lVar51 = 0;
        pfVar52 = (float *)((long)pfVar48 + (ulong)(uint)((int)(uVar29 >> 0x1f) << 5));
        do {
          fVar7 = pfVar49[uVar59] * *pfVar52;
          auVar60 = vinsertps_avx(ZEXT416(*(uint *)(lVar57 + lVar51 * 4)),
                                  ZEXT416(*(uint *)(lVar54 + lVar51 * 4)),0x10);
          auVar90._0_4_ = fVar7 * auVar60._0_4_;
          auVar90._4_4_ = fVar7 * auVar60._4_4_;
          auVar90._8_4_ = fVar7 * auVar60._8_4_;
          auVar90._12_4_ = fVar7 * auVar60._12_4_;
          auVar60 = vandps_avx(auVar90,auVar79);
          auVar60 = vmovlhps_avx(auVar90,auVar60);
          auVar81._0_4_ = auVar96._0_4_ + auVar60._0_4_;
          auVar81._4_4_ = auVar96._4_4_ + auVar60._4_4_;
          auVar81._8_4_ = auVar96._8_4_ + auVar60._8_4_;
          auVar81._12_4_ = auVar96._12_4_ + auVar60._12_4_;
          auVar96 = ZEXT1664(auVar81);
          pfVar52 = pfVar52 + (ulong)(~uVar28 >> 0x1f) * 2 + -1;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 9);
        uVar33 = uVar33 + 0x18;
        uVar59 = uVar59 + (ulong)(-1 < (int)uVar46) * 2 + -1;
        lVar54 = lVar54 + 0x60;
        lVar57 = lVar57 + 0x60;
      } while (uVar33 < uVar46 * 0x18 + 0x198);
      fVar7 = gauss_s2_arr[lVar50];
      auVar20._4_4_ = fVar7;
      auVar20._0_4_ = fVar7;
      auVar20._8_4_ = fVar7;
      auVar20._12_4_ = fVar7;
      auVar62 = vmulps_avx512vl(auVar81,auVar20);
      lVar50 = lVar50 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar55) = auVar62;
      auVar82._0_4_ = auVar62._0_4_ * auVar62._0_4_;
      auVar82._4_4_ = auVar62._4_4_ * auVar62._4_4_;
      auVar82._8_4_ = auVar62._8_4_ * auVar62._8_4_;
      auVar82._12_4_ = auVar62._12_4_ * auVar62._12_4_;
      auVar60 = vmovshdup_avx(auVar82);
      auVar61 = vfmadd231ss_fma(auVar60,auVar62,auVar62);
      auVar60 = vshufpd_avx(auVar62,auVar62,1);
      auVar61 = vfmadd213ss_fma(auVar60,auVar60,auVar61);
      auVar60 = vshufps_avx(auVar62,auVar62,0xff);
      auVar60 = vfmadd213ss_fma(auVar60,auVar60,auVar61);
      fVar75 = fVar75 + auVar60._0_4_;
      lVar55 = lVar55 + 4;
      uVar46 = uVar46 + 5;
      uVar37 = uVar37 + 0x78;
      lVar47 = lVar47 + 0x1e0;
      lVar34 = lVar34 + 0x1e0;
    } while (iVar58 + 4 != (int)lVar50);
    lVar56 = lVar56 + 0x14;
    uVar29 = (ulong)(uVar28 + 5);
  } while ((int)uVar28 < 3);
  if (fVar75 < 0.0) {
    fVar75 = sqrtf(fVar75);
  }
  else {
    auVar60 = vsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
    fVar75 = auVar60._0_4_;
  }
  auVar96 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar75)));
  lVar56 = 0;
  do {
    auVar98 = vmulps_avx512f(auVar96,*(undefined1 (*) [64])(ipoint->descriptor + lVar56));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar56) = auVar98;
    lVar56 = lVar56 + 0x10;
  } while (lVar56 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}